

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_1d_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_10310e3::
BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
::Common(BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
         *this,int block_size)

{
  bool bVar1;
  int iVar2;
  int in_ESI;
  long *in_RDI;
  AssertionResult gtest_ar;
  int c;
  int r;
  unsigned_short *p_src1;
  unsigned_short *p_src0;
  int in_stack_ffffffffffffff6c;
  AssertHelper *in_stack_ffffffffffffff70;
  undefined4 uVar3;
  undefined4 uVar4;
  long *rhs_expression;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar5;
  Type in_stack_ffffffffffffff9c;
  AssertHelper *in_stack_ffffffffffffffa0;
  AssertionResult local_58;
  int local_44;
  int local_40;
  long *local_20;
  Message *in_stack_ffffffffffffffe8;
  Message *message;
  undefined4 in_stack_fffffffffffffff0;
  
  *(uint *)(in_RDI + 0x1402a) = (uint)::block_size_wide[in_ESI];
  *(uint *)((long)in_RDI + 0xa0154) = (uint)::block_size_high[in_ESI];
  rhs_expression = in_RDI + 3;
  uVar3 = 0x21;
  iVar2 = libaom_test::ACMRandom::operator()
                    ((ACMRandom *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  *(int *)((long)in_RDI + 0x5003c) = iVar2;
  uVar4 = 0x281;
  iVar2 = libaom_test::ACMRandom::operator()
                    ((ACMRandom *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  *(int *)(in_RDI + 0xa007) = iVar2 + (int)in_RDI[0x1402a];
  iVar2 = libaom_test::ACMRandom::operator()
                    ((ACMRandom *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  *(int *)((long)in_RDI + 0x78044) = iVar2;
  iVar2 = libaom_test::ACMRandom::operator()
                    ((ACMRandom *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  *(int *)(in_RDI + 0xf008) = iVar2 + (int)in_RDI[0x1402a];
  iVar2 = libaom_test::ACMRandom::operator()
                    ((ACMRandom *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  *(int *)((long)in_RDI + 0xa004c) = iVar2;
  iVar2 = libaom_test::ACMRandom::operator()
                    ((ACMRandom *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  *(int *)(in_RDI + 0x14009) = iVar2 + (int)in_RDI[0x1402a];
  iVar2 = libaom_test::ACMRandom::operator()
                    ((ACMRandom *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  if (iVar2 == 0) {
    message = (Message *)(in_RDI + 0xa008);
    local_20 = in_RDI + 0xf009;
  }
  else if (iVar2 == 1) {
    message = (Message *)(in_RDI + 0x5007);
    *(int *)(in_RDI + 0xf008) = (int)in_RDI[0xa007];
    *(undefined4 *)((long)in_RDI + 0x78044) = *(undefined4 *)((long)in_RDI + 0x5003c);
    local_20 = in_RDI + 0xf009;
  }
  else {
    if (iVar2 != 2) {
      testing::Message::Message((Message *)in_stack_ffffffffffffffa0);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                 (char *)CONCAT44(in_stack_ffffffffffffff94,iVar2),(int)((ulong)in_RDI >> 0x20),
                 (char *)rhs_expression);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 in_stack_ffffffffffffffe8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff70);
      testing::Message::~Message((Message *)0xa7a265);
      return;
    }
    message = (Message *)(in_RDI + 0xa008);
    local_20 = in_RDI + 0x5007;
    *(int *)(in_RDI + 0x14009) = (int)in_RDI[0xa007];
    *(undefined4 *)((long)in_RDI + 0xa004c) = *(undefined4 *)((long)in_RDI + 0x5003c);
  }
  (**(code **)(*in_RDI + 0x30))(in_RDI,message,local_20);
  local_40 = 0;
  do {
    if (*(int *)((long)in_RDI + 0xa0154) <= local_40) {
      return;
    }
    for (local_44 = 0; local_44 < (int)in_RDI[0x1402a]; local_44 = local_44 + 1) {
      testing::internal::EqHelper::Compare<unsigned_short,_unsigned_short,_nullptr>
                ((char *)in_RDI,(char *)rhs_expression,(unsigned_short *)CONCAT44(uVar4,uVar3),
                 (unsigned_short *)in_stack_ffffffffffffff70);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_ffffffffffffffa0);
        in_stack_ffffffffffffff70 =
             (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xa7a38a);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,iVar2),(int)((ulong)in_RDI >> 0x20),
                   (char *)rhs_expression);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),message);
        testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff70);
        testing::Message::~Message((Message *)0xa7a3d8);
      }
      uVar5 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xa7a438);
      if (uVar5 != 0) {
        return;
      }
      in_stack_ffffffffffffff94 = 0;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

void Common(int block_size) {
    w_ = block_size_wide[block_size];
    h_ = block_size_high[block_size];

    dst_offset_ = this->rng_(33);
    dst_stride_ = this->rng_(kMaxWidth + 1 - w_) + w_;

    src0_offset_ = this->rng_(33);
    src0_stride_ = this->rng_(kMaxWidth + 1 - w_) + w_;

    src1_offset_ = this->rng_(33);
    src1_stride_ = this->rng_(kMaxWidth + 1 - w_) + w_;

    T *p_src0;
    T *p_src1;

    switch (this->rng_(3)) {
      case 0:  // Separate sources
        p_src0 = src0_;
        p_src1 = src1_;
        break;
      case 1:  // src0 == dst
        p_src0 = dst_tst_;
        src0_stride_ = dst_stride_;
        src0_offset_ = dst_offset_;
        p_src1 = src1_;
        break;
      case 2:  // src1 == dst
        p_src0 = src0_;
        p_src1 = dst_tst_;
        src1_stride_ = dst_stride_;
        src1_offset_ = dst_offset_;
        break;
      default: FAIL();
    }

    Execute(p_src0, p_src1);

    for (int r = 0; r < h_; ++r) {
      for (int c = 0; c < w_; ++c) {
        ASSERT_EQ(dst_ref_[dst_offset_ + r * dst_stride_ + c],
                  dst_tst_[dst_offset_ + r * dst_stride_ + c]);
      }
    }
  }